

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::NewSlotA(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,SQObjectPtr *attrs,
              bool bstatic,bool raw)

{
  byte bVar1;
  byte bVar2;
  undefined8 in_RCX;
  SQObjectPtr *in_RDX;
  SQVM *in_RSI;
  SQVM *in_RDI;
  int *in_R8;
  byte in_R9B;
  SQObjectPtr *unaff_retaddr;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  SQObjectPtr *in_stack_00000010;
  SQVM *in_stack_00000018;
  SQObjectPtr *mm;
  SQClass *c;
  SQObjectPtr *in_stack_ffffffffffffff68;
  SQVM *in_stack_ffffffffffffff70;
  SQVM *this_00;
  SQMetaMethod mm_00;
  SQWeakRef *in_stack_ffffffffffffffb8;
  SQCollectable *key_00;
  undefined6 in_stack_ffffffffffffffc8;
  bool in_stack_ffffffffffffffff;
  bool bVar3;
  
  mm_00 = (SQMetaMethod)((ulong)in_RCX >> 0x20);
  bVar2 = in_R9B & 1;
  bVar1 = in_stack_00000008 & 1;
  if (*(int *)&(in_RSI->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0x8004000) {
    key_00 = (SQCollectable *)(in_RSI->super_SQCollectable).super_SQRefCounted._uiRef;
    if ((bVar1 == 0) &&
       (in_stack_ffffffffffffffb8 = (SQWeakRef *)&key_00[7]._prev,
       *(int *)in_stack_ffffffffffffffb8 != 0x1000001)) {
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      this_00 = (SQVM *)&stack0xffffffffffffffa8;
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00,(bool)(bVar2 & 1));
      Push(this_00,in_stack_ffffffffffffff68);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
      bVar3 = CallMetaMethod(in_RSI,in_RDX,mm_00,(SQInteger)this_00,in_stack_ffffffffffffff68);
    }
    else {
      bVar3 = NewSlot(in_stack_00000018,in_stack_00000010,
                      (SQObjectPtr *)CONCAT71(in_stack_00000009,in_stack_00000008),unaff_retaddr,
                      in_stack_ffffffffffffffff);
      if (bVar3) {
        if (*in_R8 != 0x1000001) {
          SQClass::SetAttributes
                    ((SQClass *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffc8)),
                     (SQObjectPtr *)key_00,(SQObjectPtr *)in_stack_ffffffffffffffb8);
        }
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
    }
  }
  else {
    Raise_Error(in_RDI,"object must be a class");
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool SQVM::NewSlotA(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,const SQObjectPtr &attrs,bool bstatic,bool raw)
{
    if(sq_type(self) != OT_CLASS) {
        Raise_Error(_SC("object must be a class"));
        return false;
    }
    SQClass *c = _class(self);
    if(!raw) {
        SQObjectPtr &mm = c->_metamethods[MT_NEWMEMBER];
        if(sq_type(mm) != OT_NULL ) {
            Push(self); Push(key); Push(val);
            Push(attrs);
            Push(bstatic);
            return CallMetaMethod(mm,MT_NEWMEMBER,5,temp_reg);
        }
    }
    if(!NewSlot(self, key, val,bstatic))
        return false;
    if(sq_type(attrs) != OT_NULL) {
        c->SetAttributes(key,attrs);
    }
    return true;
}